

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O1

int __thiscall
GEO::geofile::import_point
          (geofile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *split_string_vector,string *import_path,int *line_number)

{
  pointer pbVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  int *piVar6;
  long lVar7;
  undefined8 uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  pair<const_int,_GEO::point> local_58;
  
  pbVar1 = (split_string_vector->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar3 = is_integer(pbVar1 + 1);
  if ((((bVar3) && (bVar3 = is_e_notation(pbVar1 + 2), bVar3)) &&
      (bVar3 = is_e_notation(pbVar1 + 3), bVar3)) && (bVar3 = is_e_notation(pbVar1 + 4), bVar3)) {
    bVar3 = is_e_notation(pbVar1 + 5);
    if (((!bVar3) && (iVar4 = std::__cxx11::string::compare((char *)(pbVar1 + 5)), iVar4 != 0)) &&
       (iVar4 = std::__cxx11::string::compare
                          ((char *)((split_string_vector->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 5)), iVar4 != 0))
    goto LAB_0012c42c;
  }
  else {
LAB_0012c42c:
    iVar4 = std::__cxx11::string::compare
                      ((char *)((split_string_vector->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 5));
    if (iVar4 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error: Invalid value (line ",0x1b);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*line_number);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," of ",4);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(import_path->_M_dataplus)._M_p,import_path->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      return 1;
    }
  }
  pcVar2 = (split_string_vector->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
  piVar6 = __errno_location();
  iVar4 = *piVar6;
  *piVar6 = 0;
  dVar9 = strtod(pcVar2,(char **)&local_58);
  if ((char *)CONCAT44(local_58._4_4_,local_58.first) == pcVar2) {
    std::__throw_invalid_argument("stod");
LAB_0012c715:
    std::__throw_invalid_argument("stod");
LAB_0012c721:
    std::__throw_invalid_argument("stod");
LAB_0012c72d:
    std::__throw_invalid_argument("stoi");
  }
  else {
    if (*piVar6 == 0) {
LAB_0012c52b:
      *piVar6 = iVar4;
    }
    else if (*piVar6 == 0x22) {
      std::__throw_out_of_range("stod");
      goto LAB_0012c52b;
    }
    pcVar2 = (split_string_vector->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
    iVar4 = *piVar6;
    *piVar6 = 0;
    dVar10 = strtod(pcVar2,(char **)&local_58);
    if ((char *)CONCAT44(local_58._4_4_,local_58.first) == pcVar2) goto LAB_0012c715;
    if (*piVar6 == 0) {
LAB_0012c573:
      *piVar6 = iVar4;
    }
    else if (*piVar6 == 0x22) {
      std::__throw_out_of_range("stod");
      goto LAB_0012c573;
    }
    pcVar2 = (split_string_vector->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[4]._M_dataplus._M_p;
    iVar4 = *piVar6;
    *piVar6 = 0;
    dVar11 = strtod(pcVar2,(char **)&local_58);
    if ((char *)CONCAT44(local_58._4_4_,local_58.first) == pcVar2) goto LAB_0012c721;
    if (*piVar6 == 0) {
LAB_0012c5be:
      *piVar6 = iVar4;
    }
    else if (*piVar6 == 0x22) {
      std::__throw_out_of_range("stod");
      goto LAB_0012c5be;
    }
    iVar4 = std::__cxx11::string::compare
                      ((char *)((split_string_vector->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 5));
    if ((iVar4 == 0) ||
       (iVar4 = std::__cxx11::string::compare
                          ((char *)((split_string_vector->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 5)), iVar4 == 0)) {
LAB_0012c655:
      dVar12 = this->mesh_spacing;
    }
    else {
      iVar4 = std::__cxx11::string::compare
                        ((char *)((split_string_vector->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 5));
      if (iVar4 == 0) {
        dVar12 = 0.0;
      }
      else {
        pcVar2 = (split_string_vector->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[5]._M_dataplus._M_p;
        iVar4 = *piVar6;
        *piVar6 = 0;
        dVar12 = strtod(pcVar2,(char **)&local_58);
        if ((char *)CONCAT44(local_58._4_4_,local_58.first) == pcVar2) goto LAB_0012c745;
        if (*piVar6 == 0) {
          *piVar6 = iVar4;
        }
        else if (*piVar6 == 0x22) {
          std::__throw_out_of_range("stod");
          goto LAB_0012c655;
        }
      }
    }
    pcVar2 = (split_string_vector->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    iVar4 = *piVar6;
    *piVar6 = 0;
    lVar7 = strtol(pcVar2,(char **)&local_58,10);
    if ((char *)CONCAT44(local_58._4_4_,local_58.first) == pcVar2) goto LAB_0012c72d;
    local_58.first = (int)lVar7;
    if ((local_58.first == lVar7) && (*piVar6 != 0x22)) {
      if (*piVar6 == 0) {
        *piVar6 = iVar4;
      }
      local_58.second.x = dVar9;
      local_58.second.y = dVar10;
      local_58.second.z = dVar11;
      local_58.second.char_len = dVar12;
      std::
      _Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
      ::_M_insert_unique<std::pair<int_const,GEO::point>>
                ((_Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
                  *)&this->points_map,&local_58);
      return 0;
    }
  }
  std::__throw_out_of_range("stoi");
LAB_0012c745:
  uVar8 = std::__throw_invalid_argument("stod");
  if (*piVar6 == 0) {
    *piVar6 = iVar4;
  }
  _Unwind_Resume(uVar8);
}

Assistant:

int GEO::geofile::import_point( std::vector<std::string> &split_string_vector,
                                std::string &import_path,
                                int &line_number)
{
    if ( (is_integer(split_string_vector[1])==true)&&
         (is_e_notation(split_string_vector[2])==true)&&
         (is_e_notation(split_string_vector[3])==true)&&
         (is_e_notation(split_string_vector[4])==true)&&
         ( (is_e_notation(split_string_vector[5])==true)||
           (split_string_vector[5]=="MeshSpac")||
           (split_string_vector[5]=="cl__1") )||
           (split_string_vector[5]==";") )
    {
        point input_point;
        input_point.x = std::stod(split_string_vector[2]);
        input_point.y = std::stod(split_string_vector[3]);
        input_point.z = std::stod(split_string_vector[4]);
        if( (split_string_vector[5]=="MeshSpac")||
            (split_string_vector[5]=="cl__1") )
        {
            input_point.char_len = mesh_spacing;
        }
        else
        {
            if (split_string_vector[5]!=";")
                input_point.char_len = std::stod(split_string_vector[5]);
            else
                input_point.char_len = 0;
        }
        points_map.insert({std::stoi(split_string_vector[1]), input_point});
        return EXIT_SUCCESS;
    }
    else
    {
        std::cout << "Error: Invalid value (line "
        << line_number << " of "
        << import_path << ")" << std::endl;
        return EXIT_FAILURE;
    }
}